

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_info.c
# Opt level: O0

void add_role(CHAR_DATA *ch,char *string)

{
  char *pcVar1;
  char *in_RSI;
  long in_RDI;
  char *strtime;
  char obuf [16384];
  char buf [16384];
  char local_8018 [32];
  char *in_stack_ffffffffffff8008;
  char local_4018 [16392];
  char *local_10;
  long local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  pcVar1 = ctime(&current_time);
  chomp(pcVar1);
  if (*(long *)(*(long *)(local_8 + 0xc0) + 0xb20) == 0) {
    strcpy(local_4018,"");
  }
  else {
    sprintf(local_4018,"%s",*(undefined8 *)(*(long *)(local_8 + 0xc0) + 0xb20));
  }
  sprintf(local_8018,"Role entry added on %s at level %d (%d hours):\n\r",pcVar1,
          (ulong)(uint)(int)*(short *)(local_8 + 0x138),
          ((*(int *)(local_8 + 0x13c) + current_time) - *(long *)(local_8 + 0x148)) / 0xe10 &
          0xffffffff);
  strcat(local_4018,local_8018);
  strcat(local_4018,local_10);
  strcat(local_4018,"\n\r");
  free_pstring(pcVar1);
  pcVar1 = palloc_string(in_stack_ffffffffffff8008);
  *(char **)(*(long *)(local_8 + 0xc0) + 0xb20) = pcVar1;
  return;
}

Assistant:

void add_role(CHAR_DATA *ch, char *string)
{
	char buf[MAX_BUF], obuf[MAX_BUF];

	auto strtime = ctime(&current_time);
	chomp(strtime);

	if (ch->pcdata->role)
		sprintf(buf, "%s", ch->pcdata->role);
	else
		strcpy(buf, "");

	sprintf(obuf, "Role entry added on %s at level %d (%d hours):\n\r",
		strtime,
		ch->level,
		(int)((ch->played + current_time - ch->logon) / 3600));

	strcat(buf, obuf);
	strcat(buf, string);
	strcat(buf, "\n\r");

	free_pstring(ch->pcdata->role);
	ch->pcdata->role = palloc_string(buf);
}